

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStackSwitch(BinaryInstWriter *this,StackSwitch *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *this_01;
  bool bVar1;
  U32LEB x;
  HeapType type;
  
  bVar1 = wasm::Type::isContinuation(&curr->cont->type);
  if (bVar1) {
    BufferWithRandomAccess::operator<<(this->o,-0x1b);
    this_00 = this->parent;
    type = wasm::Type::getHeapType(&curr->cont->type);
    WasmBinaryWriter::writeIndexedHeapType(this_00,type);
    this_01 = this->o;
    x.value = WasmBinaryWriter::getTagIndex(this->parent,(Name)(curr->tag).super_IString.str);
    BufferWithRandomAccess::operator<<(this_01,x);
    return;
  }
  __assert_fail("curr->cont->type.isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0xaa9,"void wasm::BinaryInstWriter::visitStackSwitch(StackSwitch *)");
}

Assistant:

void BinaryInstWriter::visitStackSwitch(StackSwitch* curr) {
  assert(curr->cont->type.isContinuation());
  o << int8_t(BinaryConsts::Switch);
  parent.writeIndexedHeapType(curr->cont->type.getHeapType());
  o << U32LEB(parent.getTagIndex(curr->tag));
}